

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,Mask *m)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  IntVect local_48;
  int local_38;
  int local_34;
  
  uVar1 = (m->super_BaseFab<int>).nvar;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(Mask: ",7);
  poVar6 = operator<<(os,&(m->super_BaseFab<int>).domain);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  local_48.vect[2] = (m->super_BaseFab<int>).domain.smallend.vect[2];
  local_48.vect._0_8_ = *(undefined8 *)(m->super_BaseFab<int>).domain.smallend.vect;
  iVar2 = (m->super_BaseFab<int>).domain.bigend.vect[2];
  if (local_48.vect[2] <= iVar2) {
    local_38 = (m->super_BaseFab<int>).domain.bigend.vect[0];
    local_34 = (m->super_BaseFab<int>).domain.bigend.vect[1];
    do {
      if ((iVar2 == local_48.vect[2]) &&
         ((local_34 < local_48.vect[1] ||
          ((local_34 == local_48.vect[1] && (local_38 < local_48.vect[0])))))) break;
      operator<<(os,&local_48);
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
          iVar3 = (m->super_BaseFab<int>).domain.smallend.vect[0];
          iVar7 = ((m->super_BaseFab<int>).domain.bigend.vect[0] - iVar3) + 1;
          iVar4 = (m->super_BaseFab<int>).domain.smallend.vect[1];
          iVar5 = (m->super_BaseFab<int>).domain.smallend.vect[2];
          iVar9 = ((m->super_BaseFab<int>).domain.bigend.vect[1] - iVar4) + 1;
          std::ostream::operator<<
                    (os,(m->super_BaseFab<int>).dptr
                        [((long)local_48.vect[0] - (long)iVar3) +
                         (long)(((local_48.vect[2] - iVar5) * iVar9 + (local_48.vect[1] - iVar4)) *
                               iVar7) +
                         (long)iVar7 * uVar8 *
                         (long)(((m->super_BaseFab<int>).domain.bigend.vect[2] - iVar5) + 1) *
                         (long)iVar9]);
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      iVar3 = local_48.vect[0];
      iVar4 = local_48.vect[1];
      local_48.vect[0] = local_48.vect[0] + 1;
      if ((m->super_BaseFab<int>).domain.bigend.vect[0] <= iVar3) {
        local_48.vect[0] = (m->super_BaseFab<int>).domain.smallend.vect[0];
        local_48.vect[1] = local_48.vect[1] + 1;
        if ((m->super_BaseFab<int>).domain.bigend.vect[1] <= iVar4) {
          local_48.vect[1] = (m->super_BaseFab<int>).domain.smallend.vect[1];
          local_48.vect[2] = local_48.vect[2] + 1;
        }
      }
    } while (local_48.vect[2] <= iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os,
            const Mask&   m)
{
    int ncomp = m.nComp();

    os << "(Mask: " << m.box() << " " << ncomp << "\n";

    IntVect sm = m.box().smallEnd();
    IntVect bg = m.box().bigEnd();
    for (IntVect p = sm; p <= bg; m.box().next(p))
    {
        os << p;
        for (int k = 0; k < ncomp; k++)
            os << "  " << m(p,k);
        os << "\n";
    }
    os << ")\n";

    BL_ASSERT(os.good());

    return os;
}